

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_view_info.cpp
# Opt level: O2

unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> __thiscall
duckdb::CreateViewInfo::Copy(CreateViewInfo *this)

{
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var1;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var2;
  type other;
  pointer pCVar3;
  pointer pSVar4;
  pointer *__ptr;
  CreateInfo *in_RSI;
  __uniq_ptr_impl<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>_> local_28;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> local_20;
  
  make_uniq<duckdb::CreateViewInfo,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
            ((duckdb *)&local_28,&in_RSI->catalog,&in_RSI->schema,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 1));
  other = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>::
          operator*((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                     *)&local_28);
  CreateInfo::CopyProperties(in_RSI,&other->super_CreateInfo);
  pCVar3 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                       *)&local_28);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&pCVar3->aliases,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&in_RSI[1].catalog.field_2);
  pCVar3 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                       *)&local_28);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
            (&(pCVar3->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             &in_RSI[1].schema._M_string_length);
  pCVar3 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                       *)&local_28);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::operator=
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&pCVar3->column_comments,
             (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&in_RSI[1].sql.field_2);
  pSVar4 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>::
           operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                       *)&in_RSI[1].dependencies.set._M_h._M_bucket_count);
  (*(pSVar4->super_SQLStatement)._vptr_SQLStatement[3])(&local_20,pSVar4);
  _Var2._M_head_impl = local_20._M_head_impl;
  local_20._M_head_impl = (SelectStatement *)0x0;
  pCVar3 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                       *)&local_28);
  _Var1._M_head_impl =
       (pCVar3->query).
       super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
       .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
  (pCVar3->query).
  super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
  super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>.
  super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (SelectStatement *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_SQLStatement + 8))();
  }
  if (local_20._M_head_impl != (SelectStatement *)0x0) {
    (*((local_20._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
  }
  (this->super_CreateInfo).super_ParseInfo._vptr_ParseInfo =
       (_func_int **)
       local_28._M_t.
       super__Tuple_impl<0UL,_duckdb::CreateViewInfo_*,_std::default_delete<duckdb::CreateViewInfo>_>
       .super__Head_base<0UL,_duckdb::CreateViewInfo_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)
         (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)this;
}

Assistant:

unique_ptr<CreateInfo> CreateViewInfo::Copy() const {
	auto result = make_uniq<CreateViewInfo>(catalog, schema, view_name);
	CopyProperties(*result);
	result->aliases = aliases;
	result->types = types;
	result->column_comments = column_comments;
	result->query = unique_ptr_cast<SQLStatement, SelectStatement>(query->Copy());
	return std::move(result);
}